

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientImpl.cpp
# Opt level: O3

shared_ptr<SL::WS_LITE::IWSClient_Configuration> __thiscall
SL::WS_LITE::WSClient_Configuration::onPong
          (WSClient_Configuration *this,
          function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_unsigned_char_*,_unsigned_long)>
          *handle)

{
  long lVar1;
  long *plVar2;
  function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_unsigned_char_*,_unsigned_long)>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *plVar3;
  shared_ptr<SL::WS_LITE::IWSClient_Configuration> sVar4;
  undefined1 local_39;
  IWSClient_Configuration local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  lVar1 = *(long *)((long)&(handle->super__Function_base)._M_functor + 8);
  plVar3 = *(long **)(lVar1 + 8);
  plVar2 = *(long **)(lVar1 + 0x10);
  while( true ) {
    if (plVar3 == plVar2) {
      local_38._vptr_IWSClient_Configuration = (_func_int **)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<SL::WS_LITE::WSClient_Configuration,std::allocator<SL::WS_LITE::WSClient_Configuration>,std::shared_ptr<SL::WS_LITE::HubContext>&>
                (&_Stack_30,(WSClient_Configuration **)&local_38,
                 (allocator<SL::WS_LITE::WSClient_Configuration> *)&local_39,
                 (shared_ptr<SL::WS_LITE::HubContext> *)
                 ((long)&(handle->super__Function_base)._M_functor + 8));
      (this->super_IWSClient_Configuration)._vptr_IWSClient_Configuration =
           local_38._vptr_IWSClient_Configuration;
      (this->Impl_).super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Stack_30._M_pi;
      sVar4.super___shared_ptr<SL::WS_LITE::IWSClient_Configuration,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RDX._M_pi;
      sVar4.super___shared_ptr<SL::WS_LITE::IWSClient_Configuration,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = &this->super_IWSClient_Configuration;
      return (shared_ptr<SL::WS_LITE::IWSClient_Configuration>)
             sVar4.
             super___shared_ptr<SL::WS_LITE::IWSClient_Configuration,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (*(long *)(*(long *)(*plVar3 + 0x38) + 0x118) != 0) break;
    std::
    function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_unsigned_char_*,_unsigned_long)>
    ::operator=((function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_unsigned_char_*,_unsigned_long)>
                 *)(*(long *)(*plVar3 + 0x38) + 0x108),in_RDX);
    plVar3 = plVar3 + 2;
  }
  __assert_fail("!t->WebSocketContext_->onPong",
                "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp"
                ,0xf3,
                "virtual std::shared_ptr<IWSClient_Configuration> SL::WS_LITE::WSClient_Configuration::onPong(const std::function<void (const std::shared_ptr<IWebSocket> &, const unsigned char *, size_t)> &)"
               );
}

Assistant:

std::shared_ptr<IWSClient_Configuration>
    WSClient_Configuration::onPong(const std::function<void(const std::shared_ptr<IWebSocket> &, const unsigned char *, size_t)> &handle)
    {

        for (auto &t : Impl_->ThreadContexts) {
            assert(!t->WebSocketContext_->onPong);
            t->WebSocketContext_->onPong = handle;
        }
        return std::make_shared<WSClient_Configuration>(Impl_);
    }